

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::appendTag(Builder *this,uint64_t tag)

{
  Exception *this_00;
  
  if (this->options->disallowTags == true) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,BuilderTagsDisallowed);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (tag < 0x100) {
    reserve(this,2);
    appendByte(this,0xee);
    appendLengthUnchecked<1ul>(this,tag);
    return;
  }
  reserve(this,9);
  appendByte(this,0xef);
  appendLengthUnchecked<8ul>(this,tag);
  return;
}

Assistant:

void Builder::appendTag(uint64_t tag) {
  if (options->disallowTags) {
    // Tagged values explicitly disallowed
    throw Exception(Exception::BuilderTagsDisallowed);
  }
  if (tag <= 255) {
    reserve(1 + 1);
    appendByte(0xee);
    appendLengthUnchecked<1>(tag);
  } else {
    reserve(1 + 8);
    appendByte(0xef);
    appendLengthUnchecked<8>(tag);
  }
}